

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

void sysbvm_dwarf_debugInfo_attribute_beginLocationExpression
               (sysbvm_dwarf_debugInfo_builder_t *builder,uintptr_t attribute)

{
  bool bVar1;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  do {
    uStack_28._0_7_ =
         CONCAT16((0x7f < attribute) << 7 | (byte)attribute & 0x7f,(undefined6)uStack_28);
    sysbvm_dynarray_add(&builder->abbrev,(void *)((long)&uStack_28 + 6));
    bVar1 = 0x7f < attribute;
    attribute = attribute >> 7;
  } while (bVar1);
  uStack_28 = CONCAT17(0x18,(undefined7)uStack_28);
  sysbvm_dynarray_add(&builder->abbrev,(void *)((long)&uStack_28 + 7));
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_attribute_beginLocationExpression(sysbvm_dwarf_debugInfo_builder_t *builder, uintptr_t attribute)
{
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, attribute);
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, DW_FORM_exprloc);
}